

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O2

void CompiledMixedType<unsigned_int,long_long>(void)

{
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  longlong u;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> su;
  ulong local_38;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> st2;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2c;
  
  u = 0;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<long_long>
            (&local_2c,&u);
  su.m_int = u;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<long_long>
            (&st2,&su);
  local_2c.m_int = 0;
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_2c
             ,&u);
  if (su.m_int._4_4_ == 0) {
    local_2c.m_int = st2.m_int;
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_2c,u);
    if ((int)((ulong)local_2c.m_int * (ulong)st2.m_int >> 0x20) == 0) {
      operator*(u,local_2c);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_2c,u);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_2c,su);
      u = 1;
      local_38._0_4_ = 1;
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_2c,(int *)&local_38);
      su.m_int = 1;
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_2c,u);
      local_38._0_4_ = 1;
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,
                 (int *)&local_38);
      SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
                (&local_2c,st2);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_2c,u);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_2c,su);
      u = 1;
      local_38._0_4_ = 1;
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,
                 (int *)&local_38);
      local_38._0_4_ = 1;
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_2c,(int *)&local_38);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_2c,u);
      SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
                (&local_2c,st2);
      operator/(u,local_2c);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_2c,u);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_2c,su);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_2c,u);
      SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
                (&local_2c,st2);
      operator+(u,local_2c);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_2c,u);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_2c,su);
      local_38._0_4_ = 0;
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_2c,(int *)&local_38);
      u = 0;
      local_38._0_4_ = 0;
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,
                 (int *)&local_38);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_2c,u);
      SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
                (&local_2c,st2);
      operator-(u,local_2c);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_2c,u);
      local_38 = CONCAT44(local_38._4_4_,1);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_2c,(int *)&local_38);
      su.m_int = 1;
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_2c,
                 (SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
      u = 1;
      su.m_int = 1;
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_2c,1);
      SVar1 = SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
                        ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>
                          *)&local_2c,su);
      operator<<(SVar1.m_int,su);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_2c,u);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_2c,su);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_2c,u);
      SVar1 = SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
                        ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>
                          *)&local_2c,su);
      operator>>(SVar1.m_int,su);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_2c,u);
      SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
                ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 &local_2c,su);
      local_38 = (ulong)(local_2c.m_int & (uint)u & (uint)su.m_int);
      SafeInt::operator_cast_to_unsigned_int((SafeInt *)&local_38);
      local_38 = u & 0xffffffffU | su.m_int;
      local_2c.m_int = (uint)su.m_int & (uint)u & local_2c.m_int & st2.m_int;
      SafeInt::operator_cast_to_unsigned_int((SafeInt *)&local_38);
      local_2c.m_int = (uint)su.m_int | (uint)u | local_2c.m_int | st2.m_int;
      local_38 = (ulong)(local_2c.m_int ^ (uint)u) ^ su.m_int;
      SafeInt::operator_cast_to_unsigned_int((SafeInt *)&local_38);
      return;
    }
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}